

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

string * __thiscall
s2textformat::ToString_abi_cxx11_
          (string *__return_storage_ptr__,s2textformat *this,
          vector<S2LatLng,_std::allocator<S2LatLng>_> *latlngs)

{
  long lVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(long *)(this + 8) != *(long *)this) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      if (lVar1 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      StringAppendF(__return_storage_ptr__,"%.15g:%.15g",
                    *(double *)(*(long *)this + lVar1) * 57.29577951308232,
                    *(double *)(*(long *)this + 8 + lVar1) * 57.29577951308232);
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (ulong)(*(long *)(this + 8) - *(long *)this >> 4));
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString(const vector<S2LatLng>& latlngs) {
  string out;
  for (int i = 0; i < latlngs.size(); ++i) {
    if (i > 0) out += ", ";
    AppendVertex(latlngs[i], &out);
  }
  return out;
}